

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void basist::astc_encode_trits(uint32_t *pOutput,uint8_t *pValues,int *bit_pos,int n)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  int bits [5];
  
  bVar2 = (byte)n;
  iVar3 = 0;
  for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 4) {
    iVar3 = iVar3 + (uint)(*pValues >> (bVar2 & 0x1f)) *
                    *(int *)((long)astc_encode_trits::s_muls + lVar4);
    *(uint *)((long)bits + lVar4) = (uint)*pValues & ~(-1 << (bVar2 & 0x1f));
    pValues = pValues + 1;
  }
  if (iVar3 < 0xf3) {
    bVar1 = g_astc_trit_encode[iVar3];
    astc_set_bits(pOutput,bit_pos,
                  bits[1] << (bVar2 + 2 & 0x1f) | (bVar1 & 3) << (bVar2 & 0x1f) | bits[0],n * 2 + 2)
    ;
    astc_set_bits(pOutput,bit_pos,
                  (uint)(bVar1 >> 7) << (bVar2 * '\x03' + 5 & 0x1f) |
                  (bVar1 >> 4 & 1) << (bVar2 + 2 & 0x1f) |
                  (bVar1 >> 5 & 3) << (bVar2 * '\x02' + 3 & 0x1f) | (bVar1 >> 2 & 3) + bits[2] * 4 |
                  bits[4] << (bVar2 * '\x02' + 5 & 0x1f) | bits[3] << (bVar2 + 3 & 0x1f),n * 3 + 6);
    return;
  }
  __assert_fail("trits < 243",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                ,0x13fd,"void basist::astc_encode_trits(uint32_t *, const uint8_t *, int &, int)");
}

Assistant:

static void astc_encode_trits(uint32_t* pOutput, const uint8_t* pValues, int& bit_pos, int n)
	{
		// First extract the trits and the bits from the 5 input values
		int trits = 0, bits[5];
		const uint32_t bit_mask = (1 << n) - 1;
		for (int i = 0; i < 5; i++)
		{
			static const int s_muls[5] = { 1, 3, 9, 27, 81 };

			const int t = pValues[i] >> n;

			trits += t * s_muls[i];
			bits[i] = pValues[i] & bit_mask;
		}

		// Encode the trits, by inverting the bit manipulations done by the decoder, converting 5 trits into 8-bits.
		// See https://www.khronos.org/registry/DataFormat/specs/1.2/dataformat.1.2.html#astc-integer-sequence-encoding

		assert(trits < 243);
		const int T = g_astc_trit_encode[trits];

		// Now interleave the 8 encoded trit bits with the bits to form the encoded output. See table 94.
		astc_set_bits(pOutput, bit_pos, bits[0] | (astc_extract_bits(T, 0, 1) << n) | (bits[1] << (2 + n)), n * 2 + 2);

		astc_set_bits(pOutput, bit_pos, astc_extract_bits(T, 2, 3) | (bits[2] << 2) | (astc_extract_bits(T, 4, 4) << (2 + n)) | (bits[3] << (3 + n)) | (astc_extract_bits(T, 5, 6) << (3 + n * 2)) |
			(bits[4] << (5 + n * 2)) | (astc_extract_bits(T, 7, 7) << (5 + n * 3)), n * 3 + 6);
	}